

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

unsigned_long Aig_Hash(Aig_Obj_t *pObj,int TableSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  unsigned_long Key;
  int TableSize_local;
  Aig_Obj_t *pObj_local;
  
  iVar3 = Aig_ObjIsExor(pObj);
  pAVar6 = Aig_ObjFanin0(pObj);
  iVar1 = pAVar6->Id;
  pAVar6 = Aig_ObjFanin1(pObj);
  iVar2 = pAVar6->Id;
  iVar4 = Aig_ObjFaninC0(pObj);
  iVar5 = Aig_ObjFaninC1(pObj);
  return (ulong)(long)(iVar5 * 0x161 ^
                      iVar4 * 0x38f ^ iVar2 * 0xb9b ^ iVar1 * 0x1f01 ^ iVar3 * 0x6a3) %
         (ulong)(long)TableSize;
}

Assistant:

long Aig_Hash( Aig_Obj_t * pObj, int TableSize ) 
{
    unsigned long Key = Aig_ObjIsExor(pObj) * 1699;
    Key ^= Aig_ObjFanin0(pObj)->Id * 7937;
    Key ^= Aig_ObjFanin1(pObj)->Id * 2971;
    Key ^= Aig_ObjFaninC0(pObj) * 911;
    Key ^= Aig_ObjFaninC1(pObj) * 353;
    return Key % TableSize;
}